

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

int mbedtls_pk_error_from_psa(psa_status_t status)

{
  int local_c;
  psa_status_t status_local;
  
  if (status + 0x99U < 2) {
LAB_0037d5ff:
    local_c = -0x3e00;
  }
  else {
    if (status == -0x97) {
      return -0x6e;
    }
    if (status != -0x93) {
      if (status == -0x92) goto LAB_0037d5ff;
      if (status != -0x91) {
        if (status == -0x8d) {
          return -0x3f80;
        }
        if (status == -0x8a) {
          return -0x3880;
        }
        if (status == -0x89) {
          return -16000;
        }
        if (status == -0x88) {
          return -0x3d00;
        }
        if (status == -0x87) {
          return -0x3a80;
        }
        if (status == -0x86) {
          return -0x3980;
        }
        if (status == -0x85) {
          return -1;
        }
        if (status == 0) {
          return 0;
        }
        return -1;
      }
    }
    local_c = -0x70;
  }
  return local_c;
}

Assistant:

int mbedtls_pk_error_from_psa(psa_status_t status)
{
    switch (status) {
        case PSA_SUCCESS:
            return 0;
        case PSA_ERROR_INVALID_HANDLE:
            return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
        case PSA_ERROR_NOT_PERMITTED:
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
        case PSA_ERROR_BUFFER_TOO_SMALL:
            return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
        case PSA_ERROR_NOT_SUPPORTED:
            return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
        case PSA_ERROR_INVALID_ARGUMENT:
            return MBEDTLS_ERR_PK_INVALID_ALG;
        case PSA_ERROR_INSUFFICIENT_MEMORY:
            return MBEDTLS_ERR_PK_ALLOC_FAILED;
        case PSA_ERROR_BAD_STATE:
            return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
        case PSA_ERROR_COMMUNICATION_FAILURE:
        case PSA_ERROR_HARDWARE_FAILURE:
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        case PSA_ERROR_DATA_CORRUPT:
        case PSA_ERROR_DATA_INVALID:
        case PSA_ERROR_STORAGE_FAILURE:
            return MBEDTLS_ERR_PK_FILE_IO_ERROR;
        case PSA_ERROR_CORRUPTION_DETECTED:
            return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        default:
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
    }
}